

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model-base-ekf-flex-estimator-imu.cpp
# Opt level: O3

Vector * __thiscall
stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::getFlexibilityVector
          (ModelBaseEKFFlexEstimatorIMU *this)

{
  ExtendedKalmanFilter *this_00;
  pointer *ppMVar1;
  Vector *pVVar2;
  pointer pMVar3;
  iterator __position;
  Matrix<double,__1,__1,_0,__1,__1> *__ptr;
  Matrix<double,__1,__1,_0,__1,__1> *pMVar4;
  double *pdVar5;
  double *pdVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  uint uVar12;
  DstEvaluatorType dstEvaluator_1;
  ulong uVar13;
  undefined1 (*__ptr_00) [16];
  long lVar14;
  undefined8 *puVar15;
  Index index;
  char *__function;
  Index index_1;
  long lVar16;
  ActualDstType actualDst;
  ulong uVar17;
  vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
  *this_01;
  ulong uVar18;
  KalmanFilterBase *this_02;
  Index size;
  double *pdVar19;
  uint uVar20;
  IMUElasticLocalFrameDynamicalSystem *this_03;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar21;
  undefined1 auVar22 [16];
  double dVar23;
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  timespec time2;
  timespec time1;
  timespec time3;
  undefined1 local_118 [16];
  Matrix<double,__1,__1,_0,__1,__1> *local_108;
  vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
  *local_f8;
  double dStack_f0;
  undefined1 local_e8 [16];
  _Map_pointer local_d8;
  size_t local_d0;
  _Elt_pointer local_c8;
  _Elt_pointer pMStack_c0;
  _Elt_pointer local_b8;
  _Map_pointer ppMStack_b0;
  KalmanFilterBase *local_a8;
  _Elt_pointer pMStack_a0;
  _Map_pointer local_90;
  timespec local_88;
  timespec local_78;
  _Elt_pointer local_68;
  _Elt_pointer pMStack_60;
  undefined1 local_50 [24];
  _Map_pointer local_38;
  
  if (this->on_ != true) {
    pVVar2 = &(this->super_EKFFlexibilityEstimatorBase).lastX_;
    lVar16 = (this->super_EKFFlexibilityEstimatorBase).lastX_.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    if (lVar16 < 0) {
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    if (lVar16 != 0) {
      memset((pVVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data,0,lVar16 << 3);
    }
    this_00 = &(this->super_EKFFlexibilityEstimatorBase).ekf_;
    uVar12 = ZeroDelayObserver::getCurrentTime((ZeroDelayObserver *)this_00);
    ZeroDelayObserver::setState((ZeroDelayObserver *)this_00,pVVar2,uVar12);
    uVar12 = ZeroDelayObserver::getMeasurementsNumber((ZeroDelayObserver *)this_00);
    if (uVar12 != 0) {
      ZeroDelayObserver::clearMeasurements((ZeroDelayObserver *)this_00);
      ZeroDelayObserver::clearInputs((ZeroDelayObserver *)this_00);
      (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
        _vptr_FlexibilityEstimatorBase[0x3e])(this);
    }
    goto LAB_0014bd6c;
  }
  clock_gettime(2,&local_78);
  clock_gettime(2,&local_88);
  this_02 = &(this->super_EKFFlexibilityEstimatorBase).ekf_.super_KalmanFilterBase;
  uVar12 = ZeroDelayObserver::getMeasurementsNumber(&this_02->super_ZeroDelayObserver);
  if (uVar12 != 0) {
    clock_gettime(2,&local_78);
    clock_gettime(2,&local_88);
    uVar12 = ZeroDelayObserver::getMeasurementTime(&this_02->super_ZeroDelayObserver);
    (this->super_EKFFlexibilityEstimatorBase).k_ = uVar12;
    uVar12 = ZeroDelayObserver::getCurrentTime(&this_02->super_ZeroDelayObserver);
    uVar12 = uVar12 + 1;
    if (uVar12 <= (this->super_EKFFlexibilityEstimatorBase).k_) {
      this_01 = (vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                 *)&this->contactPositions_;
      local_e8._0_8_ = &this->functor_;
      this_03 = &this->functor_;
      local_f8 = this_01;
      local_a8 = this_02;
      do {
        if ((this->super_EKFFlexibilityEstimatorBase).finiteDifferencesJacobians_ == true) {
          KalmanFilterBase::updatePredictedMeasurement(this_02);
          IMUElasticLocalFrameDynamicalSystem::stateDynamicsJacobian((Matrix *)local_118,this_03);
          KalmanFilterBase::setA(this_02,(Amatrix *)local_118);
          free((void *)local_118._0_8_);
          IMUElasticLocalFrameDynamicalSystem::measureDynamicsJacobian((Matrix *)local_118,this_03);
          KalmanFilterBase::setC(this_02,(Cmatrix *)local_118);
          free((void *)local_118._0_8_);
          this_01 = local_f8;
        }
        pMVar3 = (this->contactPositions_).
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((this->contactPositions_).
            super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_finish != pMVar3) {
          (this->contactPositions_).
          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pMVar3;
        }
        if ((this->functor_).nbContacts_ != 0) {
          uVar20 = 0x2a;
          uVar18 = 0;
          do {
            (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
              _vptr_FlexibilityEstimatorBase[0xe])(&local_d8,this);
            uVar13 = (ulong)uVar20;
            if ((long)(local_d0 - 3) < (long)uVar13) goto LAB_0014bdce;
            local_118._0_8_ = local_d8[uVar13];
            local_118._8_8_ = (local_d8 + uVar13)[1];
            local_108 = local_d8[uVar13 + 2];
            __position._M_current =
                 (this->contactPositions_).
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (this->contactPositions_).
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
              ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
                        (this_01,__position,(Matrix<double,_3,_1,_0,_3,_1> *)local_118);
            }
            else {
              ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
              ).m_storage.m_data.array[2] = (double)local_108;
              ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
              ).m_storage.m_data.array[0] = (double)local_118._0_8_;
              ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
              ).m_storage.m_data.array[1] = (double)local_118._8_8_;
              ppMVar1 = &(this->contactPositions_).
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppMVar1 = *ppMVar1 + 1;
            }
            free(local_d8);
            uVar18 = uVar18 + 1;
            uVar20 = uVar20 + 0xc;
          } while (uVar18 < (this->functor_).nbContacts_);
        }
        this_02 = local_a8;
        ZeroDelayObserver::getEstimatedState((ZeroDelayObserver *)local_50,(uint)local_a8);
        free((void *)local_50._0_8_);
        uVar12 = uVar12 + 1;
        this_03 = (IMUElasticLocalFrameDynamicalSystem *)local_e8._0_8_;
      } while (uVar12 <= (this->super_EKFFlexibilityEstimatorBase).k_);
    }
    ZeroDelayObserver::getEstimatedState((ZeroDelayObserver *)local_118,(uint)this_02);
    __ptr = (Matrix<double,__1,__1,_0,__1,__1> *)
            (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data;
    (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)local_118._0_8_;
    pMVar4 = (Matrix<double,__1,__1,_0,__1,__1> *)
             (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
    (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         local_118._8_8_;
    local_118._0_8_ = __ptr;
    local_118._8_8_ = pMVar4;
    free(__ptr);
    pdVar19 = (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_data;
    uVar18 = (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
    if (0 < (long)uVar18) {
      uVar13 = 0;
      do {
        if (NAN(pdVar19[uVar13])) {
          ZeroDelayObserver::setState
                    (&this_02->super_ZeroDelayObserver,
                     &(this->super_EKFFlexibilityEstimatorBase).lastX_,
                     (this->super_EKFFlexibilityEstimatorBase).k_);
          if (1 < (this->super_EKFFlexibilityEstimatorBase).k_) {
            (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
              _vptr_FlexibilityEstimatorBase[0x17])(this);
            (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
              _vptr_FlexibilityEstimatorBase[0x3e])(this);
          }
          goto LAB_0014b9b2;
        }
        uVar13 = uVar13 + 1;
      } while (uVar18 != uVar13);
    }
    pVVar2 = &(this->super_EKFFlexibilityEstimatorBase).lastX_;
    if ((this->super_EKFFlexibilityEstimatorBase).lastX_.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != uVar18) {
      if ((long)uVar18 < 0) {
        __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                      "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                     );
      }
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                ((DenseStorage<double,__1,__1,_1,_0> *)pVVar2,uVar18,uVar18,1);
      if ((this->super_EKFFlexibilityEstimatorBase).lastX_.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != uVar18)
      {
        __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
                     );
      }
    }
    pdVar5 = (pVVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    uVar13 = uVar18 - ((long)uVar18 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < (long)uVar18) {
      lVar16 = 0;
      do {
        dVar21 = (pdVar19 + lVar16)[1];
        pdVar6 = pdVar5 + lVar16;
        *pdVar6 = pdVar19[lVar16];
        pdVar6[1] = dVar21;
        lVar16 = lVar16 + 2;
      } while (lVar16 < (long)uVar13);
    }
    if ((long)uVar13 < (long)uVar18) {
      do {
        pdVar5[uVar13] = pdVar19[uVar13];
        uVar13 = uVar13 + 1;
      } while (uVar18 != uVar13);
    }
    if ((this->super_EKFFlexibilityEstimatorBase).lastX_.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 6) {
      __function = 
      "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
      ;
      goto LAB_0014bde3;
    }
    pdVar19 = (this->super_EKFFlexibilityEstimatorBase).lastX_.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    local_f8 = (vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                *)pdVar19[3];
    dStack_f0 = pdVar19[4];
    dVar21 = pdVar19[5];
    local_e8._0_8_ = dVar21;
    dVar21 = dVar21 * dVar21 + dStack_f0 * dStack_f0 + (double)local_f8 * (double)local_f8;
    if (dVar21 <= 22.206609902451056) {
      __ptr_00 = (undefined1 (*) [16])malloc(0x18);
      if (((ulong)__ptr_00 & 0xf) != 0) goto LAB_0014be42;
      if (__ptr_00 == (undefined1 (*) [16])0x0) goto LAB_0014be61;
      *(vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
        **)*__ptr_00 = local_f8;
      *(double *)(*__ptr_00 + 8) = dStack_f0;
      *(undefined8 *)__ptr_00[1] = local_e8._0_8_;
    }
    else {
      local_b8 = (_Elt_pointer)SQRT(dVar21);
      ppMStack_b0 = (_Map_pointer)0x0;
      local_c8 = (_Elt_pointer)ceil(((double)local_b8 + -3.141592653589793) / 6.283185307179586);
      __ptr_00 = (undefined1 (*) [16])malloc(0x18);
      if (((ulong)__ptr_00 & 0xf) != 0) {
LAB_0014be42:
        __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                      "void *Eigen::internal::aligned_malloc(std::size_t)");
      }
      if (__ptr_00 == (undefined1 (*) [16])0x0) {
LAB_0014be61:
        puVar15 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar15 = std::ios::widen;
        __cxa_throw(puVar15,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      dVar21 = (double)(uint)((int)(long)(double)local_c8 * 2) * -3.141592653589793 +
               (double)local_b8;
      auVar29._8_8_ = local_b8;
      auVar29._0_8_ = local_b8;
      auVar26._8_8_ = dStack_f0;
      auVar26._0_8_ = local_f8;
      auVar26 = divpd(auVar26,auVar29);
      dVar23 = dVar21 * auVar26._8_8_;
      auVar22._8_4_ = SUB84(dVar23,0);
      auVar22._0_8_ = dVar21 * auVar26._0_8_;
      auVar22._12_4_ = (int)((ulong)dVar23 >> 0x20);
      *__ptr_00 = auVar22;
      *(double *)__ptr_00[1] = ((double)local_e8._0_8_ / (double)local_b8) * dVar21;
    }
    pdVar19 = pdVar19 + 3;
    uVar18 = 3;
    if (((ulong)pdVar19 & 7) == 0) {
      uVar18 = (ulong)((uint)((ulong)pdVar19 >> 3) & 1);
    }
    uVar13 = uVar18 + (ulong)(1 < (uVar18 ^ 3)) * 2;
    if (uVar18 == 0) {
LAB_0014b8bf:
      do {
        dVar21 = *(double *)((long)(*__ptr_00 + uVar18 * 8) + 8);
        pdVar19[uVar18] = *(double *)(*__ptr_00 + uVar18 * 8);
        (pdVar19 + uVar18)[1] = dVar21;
        uVar18 = uVar18 + 2;
      } while (uVar18 < uVar13);
    }
    else {
      uVar17 = 0;
      do {
        pdVar19[uVar17] = *(double *)(*__ptr_00 + uVar17 * 8);
        uVar17 = uVar17 + 1;
      } while (uVar18 != uVar17);
      if (1 < (uint)(uVar18 ^ 3)) goto LAB_0014b8bf;
    }
    if ((uint)uVar13 < 3) {
      do {
        pdVar19[uVar13] = *(double *)(*__ptr_00 + uVar13 * 8);
        uVar13 = uVar13 + 1;
      } while (uVar13 != 3);
    }
    free(__ptr_00);
    if (this->limitOn_ == true) {
      lVar16 = (this->super_EKFFlexibilityEstimatorBase).lastX_.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      lVar14 = 0x12;
      if (0x12 < lVar16) {
        lVar14 = lVar16;
      }
      pdVar19 = (this->super_EKFFlexibilityEstimatorBase).lastX_.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      lVar16 = 0;
      do {
        if (lVar14 + -0x12 == lVar16) {
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x19a,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        dVar21 = (this->limitTorques_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[lVar16];
        if (pdVar19[lVar16 + 0x12] <= dVar21) {
          dVar21 = pdVar19[lVar16 + 0x12];
        }
        pdVar19[lVar16 + 0x12] = dVar21;
        dVar23 = (this->limitForces_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[lVar16];
        if (pdVar19[lVar16 + 0xc] <= dVar23) {
          dVar23 = pdVar19[lVar16 + 0xc];
        }
        pdVar19[lVar16 + 0xc] = dVar23;
        dVar28 = -(this->limitTorques_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                  .m_storage.m_data.array[lVar16];
        if (dVar28 <= dVar21) {
          dVar28 = dVar21;
        }
        pdVar19[lVar16 + 0x12] = dVar28;
        dVar21 = -(this->limitForces_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array[lVar16];
        if (dVar21 <= dVar23) {
          dVar21 = dVar23;
        }
        pdVar19[lVar16 + 0xc] = dVar21;
        lVar16 = lVar16 + 1;
      } while (lVar16 != 3);
    }
    uVar12 = ZeroDelayObserver::getCurrentTime(&this_02->super_ZeroDelayObserver);
    ZeroDelayObserver::setState(&this_02->super_ZeroDelayObserver,pVVar2,uVar12);
  }
LAB_0014b9b2:
  clock_gettime(2,(timespec *)(local_50 + 0x10));
  lVar14 = (long)local_38 - local_88.tv_nsec;
  lVar16 = lVar14 + 1000000000;
  if (-1 < lVar14) {
    lVar16 = lVar14;
  }
  local_88.tv_nsec = local_88.tv_nsec - local_78.tv_nsec;
  lVar14 = local_88.tv_nsec + 1000000000;
  if (-1 < local_88.tv_nsec) {
    lVar14 = local_88.tv_nsec;
  }
  this->computeFlexibilityTime_ = (double)lVar16 - (double)lVar14;
  if (8 < (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
     ) {
    pdVar19 = (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_data;
    pdVar19[6] = 0.0;
    pdVar19[7] = 0.0;
    pdVar19[8] = 0.0;
    if ((this->functor_).nbContacts_ == 0) {
      dVar21 = 0.0;
    }
    else {
      lVar16 = 8;
      uVar18 = 0;
      do {
        if ((this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows < 6) goto LAB_0014bdce;
        pdVar19 = (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_data;
        local_68 = (_Elt_pointer)pdVar19[3];
        pMStack_60 = (_Elt_pointer)pdVar19[4];
        local_b8 = (_Elt_pointer)pdVar19[5];
        ppMStack_b0 = (_Map_pointer)0x0;
        local_90 = (_Map_pointer)
                   ((double)local_b8 * (double)local_b8 +
                   (double)pMStack_60 * (double)pMStack_60 + (double)local_68 * (double)local_68);
        local_f8 = (vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                    *)SQRT((double)local_90);
        local_c8 = (_Elt_pointer)-(ulong)(9.999999999999999e-33 < (double)local_90);
        pMStack_c0 = (_Elt_pointer)0x0;
        dStack_f0 = 0.0;
        local_a8 = (KalmanFilterBase *)((ulong)local_c8 & (ulong)local_f8);
        pMStack_a0 = (_Elt_pointer)0x0;
        dVar21 = sin((double)local_a8);
        local_e8._8_4_ = extraout_XMM0_Dc;
        local_e8._0_8_ = dVar21;
        local_e8._12_4_ = extraout_XMM0_Dd;
        dVar21 = cos((double)local_a8);
        if ((this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows < 0xc) goto LAB_0014bdce;
        dVar28 = (double)(~(ulong)local_c8 & 0x3ff0000000000000 |
                         (ulong)((double)local_b8 / (double)local_f8) & (ulong)local_c8);
        dVar23 = 1.0 - dVar21;
        if (9.999999999999999e-33 < (double)local_90) {
          auVar30._8_8_ = local_f8;
          auVar30._0_8_ = local_f8;
          auVar11._8_8_ = pMStack_60;
          auVar11._0_8_ = local_68;
          auVar22 = divpd(auVar11,auVar30);
        }
        else {
          auVar22 = ZEXT816(0);
        }
        dVar33 = auVar22._0_8_;
        dVar24 = dVar23 * dVar33;
        dVar34 = auVar22._8_8_;
        pdVar6 = (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                 .m_data;
        pMVar3 = (this->contactPositions_).
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pdVar5 = (double *)
                 ((long)(pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                        m_storage.m_data.array + lVar16 + -8);
        dVar7 = *pdVar5;
        pdVar19 = (double *)
                  ((long)(pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                         m_storage.m_data.array + lVar16);
        dVar8 = *pdVar19;
        dVar9 = pdVar19[1];
        dVar25 = dVar23 * dVar34 * dVar28;
        dVar31 = ((double)local_e8._0_8_ * dVar34 + dVar28 * dVar24) * dVar9 +
                 dVar8 * (dVar24 * dVar34 - (double)local_e8._0_8_ * dVar28) +
                 dVar7 * (dVar21 + dVar24 * dVar33);
        dVar32 = (dVar25 - (double)local_e8._0_8_ * dVar33) * dVar9 +
                 dVar8 * (dVar21 + dVar34 * dVar23 * dVar34) +
                 dVar7 * ((double)local_e8._0_8_ * dVar28 + dVar24 * dVar34);
        dVar8 = pdVar6[9];
        dVar10 = pdVar6[10];
        dVar23 = dVar9 * (dVar21 + dVar23 * dVar28 * dVar28) +
                 pdVar5[1] * ((double)local_e8._0_8_ * dVar33 + dVar25) +
                 (dVar28 * dVar24 - (double)local_e8._0_8_ * dVar34) * dVar7;
        dVar21 = pdVar6[0xb];
        pdVar6[6] = dVar10 * -dVar23 + dVar8 * 0.0 + dVar21 * dVar32 + pdVar6[6];
        pdVar6[7] = dVar10 * 0.0 + dVar8 * dVar23 + dVar21 * -dVar31 + pdVar6[7];
        pdVar6[8] = ((dVar21 * 0.0 + dVar10 * dVar31) - dVar8 * dVar32) + pdVar6[8];
        uVar18 = uVar18 + 1;
        uVar12 = (this->functor_).nbContacts_;
        lVar16 = lVar16 + 0x18;
      } while (uVar18 < uVar12);
      dVar21 = (double)uVar12;
    }
    if (8 < (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows) {
      pdVar19 = (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data;
      auVar27._8_8_ = dVar21;
      auVar27._0_8_ = dVar21;
      auVar22 = divpd(*(undefined1 (*) [16])(pdVar19 + 6),auVar27);
      *(undefined1 (*) [16])(pdVar19 + 6) = auVar22;
      pdVar19[8] = pdVar19[8] / dVar21;
LAB_0014bd6c:
      (this->functor_).printed_ = false;
      return &(this->super_EKFFlexibilityEstimatorBase).lastX_;
    }
  }
LAB_0014bdce:
  __function = 
  "Eigen::Block<Eigen::Matrix<double, -1, 1>, 3, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = 3, BlockCols = 1, InnerPanel = false]"
  ;
LAB_0014bde3:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,__function);
}

Assistant:

const Vector & ModelBaseEKFFlexEstimatorIMU::getFlexibilityVector()
    {
      timespec time1, time2, time3;

      if(on_==true)
      {
        clock_gettime(CLOCK_PROCESS_CPUTIME_ID, &time1);
        clock_gettime(CLOCK_PROCESS_CPUTIME_ID, &time2);
        if (ekf_.getMeasurementsNumber()>0)
        {
          clock_gettime(CLOCK_PROCESS_CPUTIME_ID, &time1);
          clock_gettime(CLOCK_PROCESS_CPUTIME_ID, &time2);
          k_=ekf_.getMeasurementTime();

          unsigned i;
          for (i=ekf_.getCurrentTime()+1; i<=k_; ++i)
          {
            if (finiteDifferencesJacobians_)
            {
              ekf_.updatePredictedMeasurement();///triggers also ekf_.updatePrediction();

              //ekf_.setA(ekf_.getAMatrixFD(dx_));
              //ekf_.setC(ekf_.getCMatrixFD(dx_));
              ekf_.setA(functor_.stateDynamicsJacobian());
              ekf_.setC(functor_.measureDynamicsJacobian());
            }

            ///regulate the part of orientation vector in the state vector
            ///temporary code
            contactPositions_.clear();
            for (unsigned i = 0; i<functor_.getContactsNumber() ; ++i)
            {
              contactPositions_.push_back(getInput().segment<3>(42 + 12*i));
            }
            ekf_.getEstimatedState(i);
          }
          x_=ekf_.getEstimatedState(k_);
#ifndef EIGEN_VERSION_LESS_THAN_3_2
          if (! x_.hasNaN())//detect NaN values
          {
#else
          if (x_==x_)//detect NaN values
          {
#endif // EIGEN_VERSION_LESS_THAN_3_2
            lastX_=x_;

            ///regulate the part of orientation vector in the state vector
            lastX_.segment(state::ori,3)=kine::regulateOrientationVector(lastX_.segment(state::ori,3));
            if(limitOn_)
            {
              for(int i=0; i<3; i++)
              {
                // Saturation for bounded forces and torques
                lastX_[state::fc+6+i]=std::min(lastX_[state::fc+6+i],limitTorques_[i]);
                lastX_[state::fc+i]=std::min(lastX_[state::fc+i],limitForces_[i]);
                lastX_[state::fc+6+i]=std::max(lastX_[state::fc+6+i],-limitTorques_[i]);
                lastX_[state::fc+i]=std::max(lastX_[state::fc+i],-limitForces_[i]);
              }
            }
            ekf_.setState(lastX_,ekf_.getCurrentTime());
          }
          else //delete NaN values
          {
            ekf_.setState(lastX_,k_);

            if(k_>1) //the first iteration give always nan when not
              //initialized
            {
              resetCovarianceMatrices();
              resetStateCovarianceMatrix();
            }
          }
        }
        clock_gettime(CLOCK_PROCESS_CPUTIME_ID, &time3);

        computeFlexibilityTime_=(double)diff(time2,time3).tv_nsec-(double)diff(time1,time2).tv_nsec;

        // To be deleted: constrain the internal linear velocity of the flexibility of each foot to zero.
        x_.segment<3>(state::linVel).setZero();
        for(int i=0; i<functor_.getContactsNumber();++i)
        {
          x_.segment<3>(state::linVel) += kine::skewSymmetric(kine::rotationVectorToRotationMatrix(x_.segment<3>(state::ori))*contactPositions_[i])*x_.segment<3>(state::angVel);
        }
        x_.segment<3>(state::linVel)=x_.segment<3>(state::linVel)/functor_.getContactsNumber();
      }
      else
      {
        lastX_.setZero();
        ekf_.setState(lastX_,ekf_.getCurrentTime());

        if (ekf_.getMeasurementsNumber()>0)
        {
          ekf_.clearMeasurements();
          ekf_.clearInputs();
          resetStateCovarianceMatrix();
        }
      }

      functor_.setPrinted(false);
      return lastX_;
    }

    stateObservation::Matrix& ModelBaseEKFFlexEstimatorIMU::computeLocalObservationMatrix()
    {
        op_.O.resize(getMeasurementSize()*2,getStateSize());
        op_.CA.resize(getMeasurementSize(),getStateSize());
        op_.CA  = ekf_.getC();
        op_.O.block(0,0,getMeasurementSize(),getStateSize()) = op_.CA;
        op_.CA = op_.CA * ekf_.getA();
        op_.O.block(getMeasurementSize(),0,getMeasurementSize(),getStateSize()) = op_.CA;
        return op_.O;
    }

    void ModelBaseEKFFlexEstimatorIMU::setSamplingPeriod(double dt)
    {
        dt_=dt;
        functor_.setSamplingPeriod(dt);
    }

    /// Enable or disable the estimation
    void ModelBaseEKFFlexEstimatorIMU::setOn(bool & b)
    {
        on_=b;
    }

    void ModelBaseEKFFlexEstimatorIMU::setKfe(const Matrix3 & m)
    {
        functor_.setKfe(m);
    }

    void ModelBaseEKFFlexEstimatorIMU::setKfv(const Matrix3 & m)
    {
        functor_.setKfv(m);
    }

    void ModelBaseEKFFlexEstimatorIMU::setKte(const Matrix3 & m)
    {
        functor_.setKte(m);
    }

    void ModelBaseEKFFlexEstimatorIMU::setKtv(const Matrix3 & m)
    {
        functor_.setKtv(m);
    }

    void ModelBaseEKFFlexEstimatorIMU::setKfeRopes(const Matrix3 & m)
    {
        functor_.setKfeRopes(m);
    }

    void ModelBaseEKFFlexEstimatorIMU::setKfvRopes(const Matrix3 & m)
    {
        functor_.setKfvRopes(m);
    }

    void ModelBaseEKFFlexEstimatorIMU::setKteRopes(const Matrix3 & m)
    {
        functor_.setKteRopes(m);
    }

    void ModelBaseEKFFlexEstimatorIMU::setKtvRopes(const Matrix3 & m)
    {
        functor_.setKtvRopes(m);
	}

    Matrix ModelBaseEKFFlexEstimatorIMU::getKfe() const
    {
        return functor_.getKfe();
    }

    Matrix ModelBaseEKFFlexEstimatorIMU::getKfv() const
    {
        return functor_.getKfv();
    }

    Matrix ModelBaseEKFFlexEstimatorIMU::getKte() const
    {
        return functor_.getKte();
    }

    Matrix ModelBaseEKFFlexEstimatorIMU::getKtv() const
    {
        return functor_.getKtv();
    }

    double& ModelBaseEKFFlexEstimatorIMU::getComputeFlexibilityTime()
    {
        return computeFlexibilityTime_;
    }

    void ModelBaseEKFFlexEstimatorIMU::setWithForcesMeasurements(bool b)
    {
      if (useFTSensors_!= b)
      {
        useFTSensors_=b;
        functor_.setWithForceMeasurements(b);
        ekf_.setMeasureSize(functor_.getMeasurementSize());

        updateMeasurementCovarianceMatrix_();
      }
    }

    void ModelBaseEKFFlexEstimatorIMU::setWithAbsolutePos(bool b)
    {
      if (withAbsolutePos_!= b)
      {
        functor_.setWithAbsolutePosition(b);
        ekf_.setMeasureSize(functor_.getMeasurementSize());
        withAbsolutePos_=b;
        updateMeasurementCovarianceMatrix_();
      }
    }

    void ModelBaseEKFFlexEstimatorIMU::setWithUnmodeledForces(bool b)
    {
      if (withUnmodeledForces_!= b)
      {
        functor_.setWithUnmodeledForces(b);
        ekf_.setMeasureSize(functor_.getMeasurementSize());
        ekf_.setInputSize(functor_.getInputSize());
        withUnmodeledForces_=b;
        updateMeasurementCovarianceMatrix_();
      }
    }

    bool ModelBaseEKFFlexEstimatorIMU::getWithForcesMeasurements()
    {
        return useFTSensors_;
    }


    void ModelBaseEKFFlexEstimatorIMU::setWithComBias(bool b)
    {
      if (withComBias_!= b)
      {
        withComBias_=b;
        functor_.setWithComBias(b);
      }
    }

    void ModelBaseEKFFlexEstimatorIMU::setUnmodeledForceVariance(double d)
    {
        unmodeledForceVariance_ = d;
        if (d>0)
        {
          setWithUnmodeledForces(true);
        }
        P_=ekf_.getStateCovariance();
        P_.diagonal().segment<6>(state::unmodeledForces).setConstant(unmodeledForceVariance_);
        ekf_.setStateCovariance(P_);
    }

    void ModelBaseEKFFlexEstimatorIMU::setUnmodeledForceProcessVariance(double d)
    {
        Q_.diagonal().segment<6>(state::unmodeledForces).setConstant(d);
        ekf_.setQ(Q_);
        if (d>0)
        {
          setWithUnmodeledForces(true);
        }
    }

    void ModelBaseEKFFlexEstimatorIMU::setForceVariance(double d)
    {
        forceVariance_ = d;
        updateMeasurementCovarianceMatrix_();
    }

    void ModelBaseEKFFlexEstimatorIMU::setAbsolutePosVariance(double d)
    {
        absPosVariance_ = d;
        updateMeasurementCovarianceMatrix_();
    }

    void ModelBaseEKFFlexEstimatorIMU::setRobotMass(double m)
    {
        functor_.setRobotMass(m);
    }

}